

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_value_numeric_type(sqlite3_value *pVal)

{
  Mem *pMem;
  int eType;
  sqlite3_value *pVal_local;
  
  pMem._4_4_ = sqlite3_value_type(pVal);
  if (pMem._4_4_ == 3) {
    applyNumericAffinity(pVal,0);
    pMem._4_4_ = sqlite3_value_type(pVal);
  }
  return pMem._4_4_;
}

Assistant:

SQLITE_API int sqlite3_value_numeric_type(sqlite3_value *pVal){
  int eType = sqlite3_value_type(pVal);
  if( eType==SQLITE_TEXT ){
    Mem *pMem = (Mem*)pVal;
    applyNumericAffinity(pMem, 0);
    eType = sqlite3_value_type(pVal);
  }
  return eType;
}